

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

bfile_t * create_bfile_t(uint32_t buffer_size)

{
  bfile_t *pbVar1;
  uint8_t *puVar2;
  
  pbVar1 = (bfile_t *)malloc(0x50);
  pbVar1->flags = 0;
  pbVar1->filename = (char *)0x0;
  pbVar1->file = (FILE *)0x0;
  pbVar1->size = 0;
  pbVar1->pos = 0;
  pbVar1->ipos = 0;
  if (buffer_size == 0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = (uint8_t *)malloc((ulong)buffer_size);
  }
  pbVar1->buffer = puVar2;
  pbVar1->buffer_size = buffer_size;
  pbVar1->progress_cb = (_func_int_float_void_ptr *)0x0;
  pbVar1->progress_data = (void *)0x0;
  return pbVar1;
}

Assistant:

static
bfile_t *
create_bfile_t(
    uint32_t buffer_size )
{
    bfile_t * bfile;
    bfile = (bfile_t *)malloc( sizeof( struct bfile_s ) );
    assert( bfile != NULL );
    bfile->flags = 0;
    bfile->file = NULL;
    bfile->size = 0;
    bfile->pos = 0;
    bfile->ipos = 0;
    bfile->filename = NULL;
    if ( buffer_size ) {
      bfile->buffer = (uint8_t *)malloc( buffer_size );
      assert( bfile->buffer != NULL );
      bfile->buffer_size = buffer_size;
    }
    else {
      bfile->buffer = NULL;
      bfile->buffer_size = 0;
    }
    bfile->progress_cb = NULL;
    bfile->progress_data = NULL;
    return bfile;
}